

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_> *
deqp::gles31::bb::anon_unknown_11::blockLocationsToPtrs
          (vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
           *__return_storage_ptr__,BufferLayout *layout,
          vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
          *blockLocations,vector<void_*,_std::allocator<void_*>_> *bufPtrs)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int blockNdx;
  long lVar7;
  BlockDataPtr BVar8;
  allocator_type local_41;
  vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
  *local_40;
  vector<void_*,_std::allocator<void_*>_> *local_38;
  
  local_40 = blockLocations;
  local_38 = bufPtrs;
  std::vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>::
  vector(__return_storage_ptr__,
         ((long)(blockLocations->
                super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
                )._M_impl.super__Vector_impl_data._M_finish -
         (long)(blockLocations->
               super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
               )._M_impl.super__Vector_impl_data._M_start) / 0xc,&local_41);
  lVar4 = 2;
  lVar5 = 0;
  lVar6 = lVar4;
  for (lVar7 = 0;
      pBVar1 = (layout->blocks).
               super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar7 < (int)((ulong)((long)(layout->blocks).
                                  super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 6);
      lVar7 = lVar7 + 1) {
    pBVar2 = (local_40->
             super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
             )._M_impl.super__Vector_impl_data._M_start;
    BVar8 = getBlockDataPtr(layout,(BlockLayoutEntry *)((long)&(pBVar1->name)._M_dataplus + lVar5),
                            (void *)((long)*(int *)((long)pBVar2 + lVar6 * 4 + -4) +
                                    (long)(local_38->
                                          super__Vector_base<void_*,_std::allocator<void_*>_>).
                                          _M_impl.super__Vector_impl_data._M_start
                                          [*(int *)((long)pBVar2 + lVar6 * 4 + -8)]),
                            (&pBVar2->index)[lVar6]);
    pBVar3 = (__return_storage_ptr__->
             super__Vector_base<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
             )._M_impl.super__Vector_impl_data._M_start;
    *(void **)((long)pBVar3 + lVar4 * 4 + -8) = BVar8.ptr;
    *(long *)((long)&pBVar3->ptr + lVar4 * 4) = BVar8._8_8_;
    lVar4 = lVar4 + 4;
    lVar6 = lVar6 + 3;
    lVar5 = lVar5 + 0x40;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<BlockDataPtr> blockLocationsToPtrs (const BufferLayout& layout, const vector<BlockLocation>& blockLocations, const vector<void*>& bufPtrs)
{
	vector<BlockDataPtr> blockPtrs(blockLocations.size());

	DE_ASSERT(layout.blocks.size() == blockLocations.size());

	for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
	{
		const BlockLayoutEntry&	blockLayout		= layout.blocks[blockNdx];
		const BlockLocation&	location		= blockLocations[blockNdx];

		blockPtrs[blockNdx] = getBlockDataPtr(layout, blockLayout, (deUint8*)bufPtrs[location.index] + location.offset, location.size);
	}

	return blockPtrs;
}